

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::recordCommandBufferFinalize(CLIntercept *this,cl_command_buffer_khr cmdbuf)

{
  lock_guard<std::mutex> *in_RDI;
  map<_cl_command_buffer_khr_*,_SCommandBufferRecord,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>_>_>
  *unaff_retaddr;
  SCommandBufferRecord *recording;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffb8);
  std::
  map<_cl_command_buffer_khr_*,_SCommandBufferRecord,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>_>_>
  ::operator[](unaff_retaddr,(key_type *)in_RDI);
  SCommandBufferRecord::recordFinalize((SCommandBufferRecord *)0x208967);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x208973);
  return;
}

Assistant:

void CLIntercept::recordCommandBufferFinalize(
    cl_command_buffer_khr cmdbuf )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    SCommandBufferRecord& recording = m_CommandBufferRecordMap[ cmdbuf ];
    recording.recordFinalize();
}